

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomicops_internals_x86_gcc.h
# Opt level: O0

Atomic64 google::protobuf::internal::NoBarrier_CompareAndSwap
                   (Atomic64 *ptr,Atomic64 old_value,Atomic64 new_value)

{
  long lVar1;
  Atomic64 prev;
  Atomic64 new_value_local;
  Atomic64 old_value_local;
  Atomic64 *ptr_local;
  
  LOCK();
  lVar1 = *ptr;
  if (old_value == lVar1) {
    *ptr = new_value;
    lVar1 = old_value;
  }
  UNLOCK();
  return lVar1;
}

Assistant:

inline Atomic64 NoBarrier_CompareAndSwap(volatile Atomic64* ptr,
                                         Atomic64 old_value,
                                         Atomic64 new_value) {
  Atomic64 prev;
  __asm__ __volatile__("lock; cmpxchgq %1,%2"
                       : "=a" (prev)
                       : "q" (new_value), "m" (*ptr), "0" (old_value)
                       : "memory");
  return prev;
}